

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O0

FArchive * __thiscall FArchive::operator<<(FArchive *this,FName *n)

{
  char *pcVar1;
  FName local_1c;
  FName *local_18;
  FName *n_local;
  FArchive *this_local;
  
  local_18 = n;
  n_local = (FName *)this;
  if ((this->m_Storing & 1U) == 0) {
    pcVar1 = ReadName(this);
    FName::FName(&local_1c,pcVar1);
    FName::operator=(local_18,&local_1c);
  }
  else {
    pcVar1 = FName::GetChars(n);
    WriteName(this,pcVar1);
  }
  return this;
}

Assistant:

FArchive &FArchive::operator<< (FName &n)
{ // In an archive, a "name" is a string that might be stored multiple times,
  // so it is only stored once. It is still treated as a normal string. In the
  // rest of the game, a name is a unique identifier for a number.
	if (m_Storing)
	{
		WriteName (n.GetChars());
	}
	else
	{
		n = FName(ReadName());
	}
	return *this;
}